

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferTextureBufferRange::logError
          (TextureBufferTextureBufferRange *this,char *phase,char *internalFormat,GLuint component,
          char *exptectedValue,char *resultValue)

{
  TestLog *this_00;
  MessageBuilder *pMVar1;
  MessageBuilder local_1b8;
  char *local_38;
  char *resultValue_local;
  char *exptectedValue_local;
  char *pcStack_20;
  GLuint component_local;
  char *internalFormat_local;
  char *phase_local;
  TextureBufferTextureBufferRange *this_local;
  
  local_38 = resultValue;
  resultValue_local = exptectedValue;
  exptectedValue_local._4_4_ = component;
  pcStack_20 = internalFormat;
  internalFormat_local = phase;
  phase_local = (char *)this;
  this_00 = tcu::TestContext::getLog
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [25])"Result is different for ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&internalFormat_local);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [9])" phase \n");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [18])"Internal Format: ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&stack0xffffffffffffffe0);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [21])"Component Position: ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)((long)&exptectedValue_local + 4));
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [17])0x2ad0d0c);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&resultValue_local);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [15])"Result value: ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_38);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  return;
}

Assistant:

void TextureBufferTextureBufferRange::logError(const char* phase, const char* internalFormat, glw::GLuint component,
											   const char* exptectedValue, const char* resultValue)
{
	m_testCtx.getLog() << tcu::TestLog::Message << "Result is different for " << phase << " phase \n"
					   << "Internal Format: " << internalFormat << "\n"
					   << "Component Position: " << component << "\n"
					   << "Expected value: " << exptectedValue << "\n"
					   << "Result value: " << resultValue << "\n"
					   << tcu::TestLog::EndMessage;
}